

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O0

bool clusterDBSCAN(TSimilarityMap *sim,TValueCC epsCC,int minPts,TKeyPressCollection *keyPresses)

{
  const_iterator __position;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *this;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  iterator this_00;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  double in_XMM0_Qa;
  TValueCC *cc_1;
  int j_1;
  vector<int,_std::allocator<int>_> nbq;
  TClusterId *qcid;
  int q;
  TValueCC *cc;
  int j;
  vector<int,_std::allocator<int>_> nbi;
  TClusterId *cid_1;
  int i_1;
  int curId;
  TClusterId *cid;
  int i;
  int n;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> *this_01;
  iterator in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar5;
  vector<int,_std::allocator<int>_> local_a0;
  TClusterId *local_88;
  int local_7c;
  undefined4 local_78;
  const_reference local_68;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  TClusterId *local_40;
  int local_38;
  TClusterId local_34;
  TClusterId *local_30;
  int local_28;
  int local_24;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_20;
  int local_14;
  double local_10;
  vector<int,_std::allocator<int>_> *local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  local_8 = in_RDI;
  sVar1 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RDX);
  local_24 = (int)sVar1;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_20,(long)local_28);
    local_30 = &pvVar2->cid;
    *local_30 = -1;
  }
  local_34 = 0;
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_20,(long)local_38);
    local_40 = &pvVar2->cid;
    if (*local_40 == -1) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12b902);
      for (local_5c = 0; local_5c < local_24; local_5c = local_5c + 1) {
        pvVar3 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                               *)local_8,(long)local_38);
        local_68 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar3,(long)local_5c)
        ;
        if (local_10 < local_68->cc) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08._M_current);
        }
      }
      sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_58);
      if ((int)sVar1 < local_14) {
        *local_40 = 0;
        local_78 = 7;
      }
      else {
        local_34 = local_34 + 1;
        *local_40 = local_34;
        for (local_7c = 0; iVar5 = local_7c,
            sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_58), this = local_20,
            iVar5 < (int)sVar1; local_7c = local_7c + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_7c);
          pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](this,(long)*pvVar4);
          local_88 = &pvVar2->cid;
          if (*local_88 == 0) {
            *local_88 = local_34;
          }
          if (*local_88 == -1) {
            *local_88 = local_34;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x12bab6);
            for (iVar5 = 0; iVar5 < local_24; iVar5 = iVar5 + 1) {
              in_stack_ffffffffffffff10 = local_8;
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_7c);
              pvVar3 = std::
                       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       ::operator[]((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                     *)in_stack_ffffffffffffff10,(long)*pvVar4);
              in_stack_ffffffffffffff50._M_current =
                   (int *)std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                    (pvVar3,(long)iVar5);
              if (local_10 < ((const_reference)in_stack_ffffffffffffff50._M_current)->cc) {
                std::vector<int,_std::allocator<int>_>::push_back
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08._M_current);
              }
            }
            sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_a0);
            if (local_14 <= (int)sVar1) {
              this_01 = &local_58;
              this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         this_01,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffffef8);
              in_stack_fffffffffffffef8 = &local_a0;
              std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
              std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
              __position._M_current._4_4_ = iVar5;
              __position._M_current._0_4_ = in_stack_ffffffffffffff58;
              in_stack_ffffffffffffff08 =
                   std::vector<int,std::allocator<int>>::
                   insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                             (this_00._M_current,__position,in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
            }
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff10);
          }
        }
        local_78 = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff10);
    }
  }
  return true;
}

Assistant:

bool clusterDBSCAN(const TSimilarityMap & sim, TValueCC epsCC, int minPts, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = -1;
    }

    int curId = 0;

    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        if (cid != -1) continue;
        std::vector<int> nbi;
        for (int j = 0; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            if (cc > epsCC) nbi.push_back(j);
        }

        if ((int) nbi.size() < minPts) {
            cid = 0;
            continue;
        }

        cid = ++curId;
        for (int q = 0; q < (int) nbi.size(); ++q) {
            auto & qcid = keyPresses[nbi[q]].cid;

            if (qcid == 0) qcid = curId;
            if (qcid != -1) continue;
            qcid = curId;

            std::vector<int> nbq;
            for (int j = 0; j < n; ++j) {
                auto & cc = sim[nbi[q]][j].cc;

                if (cc > epsCC) nbq.push_back(j);
            }

            if ((int) nbq.size() >= minPts) {
                nbi.insert(nbi.end(), nbq.begin(), nbq.end());
            }
        }
    }

    return true;
}